

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O0

MSLConstexprSampler * __thiscall
spirv_cross::CompilerMSL::find_constexpr_sampler(CompilerMSL *this,uint32_t id)

{
  bool bVar1;
  pointer ppVar2;
  pointer pvVar3;
  _Node_iterator_base<std::pair<const_spirv_cross::SetBindingPair,_spirv_cross::MSLConstexprSampler>,_true>
  local_58;
  key_type local_50;
  _Node_iterator_base<std::pair<const_spirv_cross::SetBindingPair,_spirv_cross::MSLConstexprSampler>,_true>
  local_48;
  const_iterator itr_1;
  ID local_38;
  uint32_t binding;
  const_iterator cStack_30;
  uint32_t desc_set;
  _Self local_28;
  const_iterator itr;
  uint32_t id_local;
  CompilerMSL *this_local;
  
  itr._M_node._4_4_ = id;
  local_28._M_node =
       (_Base_ptr)
       ::std::
       map<unsigned_int,_spirv_cross::MSLConstexprSampler,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::MSLConstexprSampler>_>_>
       ::find(&this->constexpr_samplers_by_id,(key_type *)((long)&itr._M_node + 4));
  cStack_30 = ::std::
              end<std::map<unsigned_int,spirv_cross::MSLConstexprSampler,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,spirv_cross::MSLConstexprSampler>>>>
                        (&this->constexpr_samplers_by_id);
  bVar1 = ::std::operator!=(&local_28,&stack0xffffffffffffffd0);
  if (bVar1) {
    ppVar2 = ::std::
             _Rb_tree_const_iterator<std::pair<const_unsigned_int,_spirv_cross::MSLConstexprSampler>_>
             ::operator->(&local_28);
    this_local = (CompilerMSL *)&ppVar2->second;
  }
  else {
    TypedID<(spirv_cross::Types)0>::TypedID(&local_38,itr._M_node._4_4_);
    binding = Compiler::get_decoration((Compiler *)this,local_38,DecorationDescriptorSet);
    TypedID<(spirv_cross::Types)0>::TypedID
              ((TypedID<(spirv_cross::Types)0> *)&itr_1,itr._M_node._4_4_);
    local_50.binding =
         Compiler::get_decoration
                   ((Compiler *)this,
                    itr_1.
                    super__Node_iterator_base<std::pair<const_spirv_cross::SetBindingPair,_spirv_cross::MSLConstexprSampler>,_true>
                    ._M_cur._0_4_,DecorationBinding);
    local_50.desc_set = binding;
    itr_1.
    super__Node_iterator_base<std::pair<const_spirv_cross::SetBindingPair,_spirv_cross::MSLConstexprSampler>,_true>
    ._M_cur._4_4_ = local_50.binding;
    local_48._M_cur =
         (__node_type *)
         ::std::
         unordered_map<spirv_cross::SetBindingPair,_spirv_cross::MSLConstexprSampler,_spirv_cross::InternalHasher,_std::equal_to<spirv_cross::SetBindingPair>,_std::allocator<std::pair<const_spirv_cross::SetBindingPair,_spirv_cross::MSLConstexprSampler>_>_>
         ::find(&this->constexpr_samplers_by_binding,&local_50);
    local_58._M_cur =
         (__node_type *)
         ::std::
         end<std::unordered_map<spirv_cross::SetBindingPair,spirv_cross::MSLConstexprSampler,spirv_cross::InternalHasher,std::equal_to<spirv_cross::SetBindingPair>,std::allocator<std::pair<spirv_cross::SetBindingPair_const,spirv_cross::MSLConstexprSampler>>>>
                   (&this->constexpr_samplers_by_binding);
    bVar1 = ::std::__detail::operator!=(&local_48,&local_58);
    if (bVar1) {
      pvVar3 = ::std::__detail::
               _Node_const_iterator<std::pair<const_spirv_cross::SetBindingPair,_spirv_cross::MSLConstexprSampler>,_false,_true>
               ::operator->((_Node_const_iterator<std::pair<const_spirv_cross::SetBindingPair,_spirv_cross::MSLConstexprSampler>,_false,_true>
                             *)&local_48);
      this_local = (CompilerMSL *)&pvVar3->second;
    }
    else {
      this_local = (CompilerMSL *)0x0;
    }
  }
  return (MSLConstexprSampler *)this_local;
}

Assistant:

const MSLConstexprSampler *CompilerMSL::find_constexpr_sampler(uint32_t id) const
{
	// Try by ID.
	{
		auto itr = constexpr_samplers_by_id.find(id);
		if (itr != end(constexpr_samplers_by_id))
			return &itr->second;
	}

	// Try by binding.
	{
		uint32_t desc_set = get_decoration(id, DecorationDescriptorSet);
		uint32_t binding = get_decoration(id, DecorationBinding);

		auto itr = constexpr_samplers_by_binding.find({ desc_set, binding });
		if (itr != end(constexpr_samplers_by_binding))
			return &itr->second;
	}

	return nullptr;
}